

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

int Bmc_CollapseExpandRound
              (sat_solver *pSat,sat_solver *pSatOn,Vec_Int_t *vLits,Vec_Int_t *vNums,
              Vec_Int_t *vTemp,int nBTLimit,int fCanon,int fOnOffSetLit)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (0 < (long)vLits->nSize) {
    lVar7 = (long)vLits->nSize;
    do {
      if (vLits->nSize < lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar1 = lVar7 + -1;
      uVar2 = vLits->pArray[lVar1];
      bVar4 = false;
      if (uVar2 != 0xffffffff) {
        if (pSatOn == (sat_solver *)0x0) {
LAB_005835a0:
          if (vLits->nSize < lVar7) {
LAB_005836d3:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          vLits->pArray[lVar1] = -1;
          vTemp->nSize = 0;
          if (-1 < fOnOffSetLit) {
            Vec_IntPush(vTemp,fOnOffSetLit);
          }
          if (0 < vLits->nSize) {
            lVar6 = 0;
            do {
              if (vLits->pArray[lVar6] != -1) {
                Vec_IntPush(vTemp,vLits->pArray[lVar6]);
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < vLits->nSize);
          }
          iVar5 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,(long)nBTLimit,0,
                                   0,0);
          if (iVar5 == 0) {
            bVar4 = true;
          }
          else {
            if (iVar5 == 1) {
              if (vLits->nSize < lVar7) goto LAB_005836d3;
              vLits->pArray[lVar1] = uVar2;
            }
            bVar4 = false;
          }
        }
        else {
          if (fOnOffSetLit != -1) {
            __assert_fail("fOnOffSetLit == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                          ,0x18c,
                          "int Bmc_CollapseExpandRound(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                         );
          }
          if (fCanon != 0) {
            if ((int)uVar2 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if ((uVar2 & 1) == 0) goto LAB_0058366a;
          }
          vTemp->nSize = 0;
          if (0 < vLits->nSize) {
            lVar6 = 0;
            do {
              uVar3 = vLits->pArray[lVar6];
              if (uVar3 != 0xffffffff) {
                if ((int)uVar3 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x132,"int Abc_LitNotCond(int, int)");
                }
                Vec_IntPush(vTemp,uVar3 ^ lVar7 + -1 == lVar6);
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < vLits->nSize);
          }
          iVar5 = sat_solver_solve(pSatOn,vTemp->pArray,vTemp->pArray + vTemp->nSize,(long)nBTLimit,
                                   0,0,0);
          if (iVar5 == 0) {
            bVar4 = true;
          }
          else if (iVar5 != -1) goto LAB_005835a0;
        }
      }
LAB_0058366a:
      if (bVar4) {
        return -1;
      }
      bVar4 = 1 < lVar7;
      lVar7 = lVar1;
    } while (bVar4);
  }
  return 0;
}

Assistant:

int Bmc_CollapseExpandRound( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit )
{
    int fProfile = 0;
    int k, n, iLit, status;
    abctime clk;
    //return Bmc_CollapseExpandRound2( pSat, vLits, vTemp, nBTLimit, fOnOffSetLit );
    // try removing one literal at a time
    for ( k = Vec_IntSize(vLits) - 1; k >= 0; k-- )
    {
        int Save = Vec_IntEntry( vLits, k );
        if ( Save == -1 )
            continue;
        // check if this literal when expanded overlaps with the on-set
        if ( pSatOn )
        {
            assert( fOnOffSetLit == -1 );
            // it is ok to skip the first round if the literal is positive
            if ( fCanon && !Abc_LitIsCompl(Save) )
                continue;
            // put into new array
            Vec_IntClear( vTemp );
            Vec_IntForEachEntry( vLits, iLit, n )
                if ( iLit != -1 )
                    Vec_IntPush( vTemp, Abc_LitNotCond(iLit, k==n) );
            // check against onset
            if ( fProfile ) clk = Abc_Clock();
            status = sat_solver_solve( pSatOn, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
            if ( fProfile ) clkCheck1 += Abc_Clock() - clk;
            if ( status == l_Undef )
                return -1;
            //printf( "%d", status == l_True );
            if ( status == l_False )
            {
                if ( fProfile ) clkCheckU += Abc_Clock() - clk;
                continue;
            }
            if ( fProfile ) clkCheckS += Abc_Clock() - clk;
            // otherwise keep trying to remove it
        }
        Vec_IntWriteEntry( vLits, k, -1 );
        // put into new array
        Vec_IntClear( vTemp );
        if ( fOnOffSetLit >= 0 )
            Vec_IntPush( vTemp, fOnOffSetLit );
        Vec_IntForEachEntry( vLits, iLit, n )
            if ( iLit != -1 )
                Vec_IntPush( vTemp, iLit );
        // check against offset
        if ( fProfile ) clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
        if ( fProfile ) clkCheck2 += Abc_Clock() - clk;
//        if ( fOnOffSetLit >= 0 )
//            Vec_IntPop( vTemp );
        if ( status == l_Undef )
            return -1;
        if ( status == l_True )
        {
            Vec_IntWriteEntry( vLits, k, Save );
            if ( fProfile ) clkCheckS += Abc_Clock() - clk;
        }
        else
            if ( fProfile ) clkCheckU += Abc_Clock() - clk;
    }
//    if ( pSatOn )
//    printf( "\n" );
    return 0;
}